

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sssort.c
# Opt level: O2

void ss_swapmerge(sauchar_t *T,saidx64_t *PA,saidx64_t *first,saidx64_t *middle,saidx64_t *last,
                 saidx64_t *buf,saidx64_t bufsize,saidx64_t depth)

{
  uint uVar1;
  saint_t sVar2;
  long n;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  ulong *puVar9;
  ulong *puVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  saidx64_t *p2;
  long lVar16;
  ulong *puVar17;
  saidx64_t *local_8a0;
  ulong local_858;
  saidx64_t *local_850 [2];
  long local_840;
  anon_struct_32_4_d8a569f3 stack [64];
  
  local_850[0] = buf + -1;
  local_858 = 0;
  uVar11 = 0;
LAB_00102aea:
  local_850[1] = (saidx64_t *)((ulong *)last + 1);
  puVar4 = (ulong *)middle;
  while( true ) {
    lVar16 = (long)last - (long)puVar4;
    uVar15 = lVar16 >> 3;
    lVar12 = (long)(int)local_858;
    if ((long)uVar15 <= bufsize) break;
    lVar8 = (long)puVar4 - (long)first;
    uVar6 = lVar8 >> 3;
    if ((long)uVar6 <= bufsize) {
      if (first < puVar4) {
        puVar9 = (ulong *)(lVar8 + (long)local_850[0]);
        ss_blockswap(buf,first,uVar6);
        uVar15 = *first;
        puVar3 = (ulong *)first;
        puVar5 = (ulong *)buf;
        do {
          while( true ) {
            uVar13 = *puVar5;
            uVar6 = *puVar4;
            sVar2 = ss_compare(T,PA + uVar13,PA + uVar6,depth);
            puVar7 = puVar5;
            if (sVar2 < 0) break;
            puVar7 = puVar4;
            puVar17 = puVar3;
            if (sVar2 == 0) {
              *puVar4 = ~uVar6;
              uVar6 = *puVar5;
              puVar7 = puVar3 + 2;
              puVar17 = puVar5;
              do {
                puVar10 = puVar7;
                *puVar3 = uVar6;
                if (puVar9 <= puVar17) goto LAB_0010331e;
                puVar7 = puVar3 + 1;
                puVar3 = puVar3 + 1;
                puVar5 = puVar17 + 1;
                *puVar17 = *puVar7;
                uVar6 = puVar17[1];
                puVar7 = puVar10 + 1;
                puVar17 = puVar5;
              } while ((long)uVar6 < 0);
              uVar6 = *puVar4;
              puVar7 = puVar4;
              do {
                puVar3 = puVar10;
                puVar4 = puVar7 + 1;
                puVar3[-1] = uVar6;
                *puVar7 = *puVar3;
                if (last <= puVar4) goto LAB_00103131;
                uVar6 = *puVar4;
                puVar10 = puVar3 + 1;
                puVar7 = puVar4;
              } while ((long)uVar6 < 0);
            }
            else {
              do {
                puVar3 = puVar17 + 1;
                puVar4 = puVar7 + 1;
                *puVar17 = uVar6;
                *puVar7 = *puVar3;
                if (last <= puVar4) goto LAB_001032f0;
                uVar6 = *puVar4;
                puVar7 = puVar4;
                puVar17 = puVar3;
              } while ((long)uVar6 < 0);
            }
          }
          do {
            *puVar3 = uVar13;
            if (puVar9 <= puVar7) goto LAB_0010331e;
            puVar17 = puVar3 + 1;
            puVar3 = puVar3 + 1;
            puVar5 = puVar7 + 1;
            *puVar7 = *puVar17;
            uVar13 = puVar7[1];
            puVar7 = puVar5;
          } while ((long)uVar13 < 0);
        } while( true );
      }
      goto LAB_0010332a;
    }
    if ((long)uVar6 < (long)uVar15) {
      uVar15 = uVar6;
    }
    puVar5 = puVar4 + -1;
    n = 0;
LAB_00102b53:
    puVar3 = puVar4 + n;
    local_840 = n * 8;
    while (uVar6 = uVar15, 0 < (long)uVar6) {
      uVar15 = uVar6 >> 1;
      sVar2 = ss_compare(T,PA + ((long)puVar3[uVar15] >> 0x3f ^ puVar3[uVar15]),
                         PA + ((long)puVar5[-n - uVar15] >> 0x3f ^ puVar5[-n - uVar15]),depth);
      if (sVar2 < 0) goto code_r0x00102bc6;
    }
    if (n < 1) {
      uVar15 = *puVar4;
      sVar2 = ss_compare(T,PA + ((long)puVar4[-1] >> 0x3f ^ puVar4[-1]),PA + uVar15,depth);
      if (sVar2 == 0) {
        *puVar4 = ~uVar15;
      }
      if ((uVar11 & 1) == 0) {
        if ((uVar11 & 2) != 0) {
          uVar15 = *first;
          sVar2 = ss_compare(T,PA + ((long)((ulong *)first)[-1] >> 0x3f ^ ((ulong *)first)[-1]),
                             PA + uVar15,depth);
          if (sVar2 == 0) goto LAB_00103242;
        }
      }
      else {
        uVar15 = *first;
LAB_00103242:
        *first = ~uVar15;
      }
      if ((uVar11 & 4) != 0) {
        uVar15 = *last;
        sVar2 = ss_compare(T,PA + ((long)((ulong *)last)[-1] >> 0x3f ^ ((ulong *)last)[-1]),
                           PA + uVar15,depth);
        if (sVar2 == 0) {
          *last = ~uVar15;
        }
      }
      if ((int)local_858 == 0) {
        return;
      }
      local_858 = (ulong)((int)local_858 - 1);
      first = (saidx64_t *)(&local_858)[lVar12 * 4];
      middle = local_850[lVar12 * 4];
      last = local_850[lVar12 * 4 + 1];
      uVar11 = stack[lVar12 + -1].d;
      goto LAB_00102aea;
    }
    middle = (saidx64_t *)((long)puVar4 - local_840);
    ss_blockswap(middle,(saidx64_t *)puVar4,n);
    uVar14 = 0;
    puVar9 = puVar4;
    puVar7 = puVar4;
    if (puVar3 < last) {
      if ((long)*puVar3 < 0) {
        *puVar3 = ~*puVar3;
        if (first < middle) {
          do {
            lVar8 = lVar8 + -8;
            puVar5 = puVar9 + -1;
            puVar9 = puVar9 + -1;
          } while ((long)*puVar5 < 0);
          uVar14 = 5;
        }
        else {
          uVar14 = 1;
        }
      }
      else if (first < middle) {
        lVar16 = (long)local_850[1] - (long)puVar4;
        do {
          lVar16 = lVar16 + -8;
          puVar7 = puVar5 + 1;
          puVar5 = puVar5 + 1;
        } while ((long)*puVar7 < 0);
        uVar14 = 2;
        puVar7 = puVar5;
      }
    }
    if (lVar8 <= lVar16) {
      stack[lVar12].a = (saidx64_t *)puVar7;
      stack[lVar12].b = (saidx64_t *)puVar3;
      stack[lVar12].c = last;
      local_858 = (ulong)((int)local_858 + 1);
      stack[lVar12].d = uVar11 & 4 | uVar14 & 3;
      uVar11 = uVar14 & 0xfffffffc | uVar11 & 3;
      last = (saidx64_t *)puVar9;
      goto LAB_00102aea;
    }
    uVar1 = uVar14 ^ 6;
    if ((uVar14 & 2) == 0) {
      uVar1 = uVar14;
    }
    if (puVar7 != puVar4) {
      uVar1 = uVar14;
    }
    stack[lVar12].a = first;
    stack[lVar12].b = middle;
    stack[lVar12].c = (saidx64_t *)puVar9;
    local_858 = (ulong)((int)local_858 + 1);
    stack[lVar12].d = uVar1 & 0xfffffffc | uVar11 & 3;
    uVar11 = uVar11 & 4 | uVar1 & 3;
    puVar4 = puVar3;
    first = (saidx64_t *)puVar7;
  }
  if ((puVar4 < last) && (first < puVar4)) {
    puVar5 = (ulong *)((long)local_850[0] + lVar16);
    ss_blockswap(buf,(saidx64_t *)puVar4,uVar15);
    uVar15 = *(ulong *)((long)buf + lVar16 + -8);
    uVar6 = puVar4[-1];
    puVar4 = puVar4 + -1;
    uVar13 = (ulong)(2 - (int)((long)uVar15 >> 0x3f));
    if (-1 < (long)uVar6) {
      uVar13 = uVar15 >> 0x3f;
    }
    local_8a0 = PA + ((long)uVar15 >> 0x3f ^ uVar15);
    p2 = PA + ((long)uVar6 >> 0x3f ^ uVar6);
    puVar3 = (ulong *)last + -1;
    uVar15 = ((ulong *)last)[-1];
    while( true ) {
      while( true ) {
        while( true ) {
          sVar2 = ss_compare(T,local_8a0,p2,depth);
          uVar14 = (uint)uVar13;
          puVar9 = (ulong *)buf;
          if (sVar2 < 1) break;
          uVar6 = *puVar5;
          puVar7 = puVar5;
          if ((uVar13 & 1) != 0) {
            do {
              *puVar3 = uVar6;
              puVar7 = puVar3 + -1;
              puVar3 = puVar3 + -1;
              *puVar5 = *puVar7;
              uVar6 = puVar5[-1];
              puVar5 = puVar5 + -1;
            } while ((long)uVar6 < 0);
            uVar13 = (ulong)(uVar14 & 0xfffffffe);
            puVar7 = puVar5;
          }
          *puVar3 = uVar6;
          if (puVar7 <= buf) goto LAB_0010338b;
          puVar3 = puVar3 + -1;
          puVar5 = puVar7 + -1;
          *puVar7 = *puVar3;
          uVar6 = puVar7[-1];
          if ((long)uVar6 < 0) {
            local_8a0 = PA + ~uVar6;
            uVar13 = (ulong)((uint)uVar13 | 1);
          }
          else {
            local_8a0 = PA + uVar6;
          }
        }
        if (-1 < sVar2) break;
        uVar6 = *puVar4;
        if ((uVar13 & 2) != 0) {
          do {
            *puVar3 = uVar6;
            puVar9 = puVar3 + -1;
            puVar3 = puVar3 + -1;
            *puVar4 = *puVar9;
            uVar6 = puVar4[-1];
            puVar4 = puVar4 + -1;
          } while ((long)uVar6 < 0);
          uVar13 = (ulong)(uVar14 & 0xfffffffd);
        }
        *puVar3 = uVar6;
        puVar9 = puVar3 + -1;
        puVar3 = puVar3 + -1;
        *puVar4 = *puVar9;
        puVar4 = puVar4 + -1;
        if (puVar4 < first) goto LAB_001032c5;
        uVar6 = *puVar4;
        if ((long)uVar6 < 0) {
          uVar13 = (ulong)((uint)uVar13 | 2);
          uVar6 = ~uVar6;
        }
        p2 = PA + uVar6;
      }
      uVar6 = *puVar5;
      if ((uVar13 & 1) != 0) {
        do {
          *puVar3 = uVar6;
          puVar7 = puVar3 + -1;
          puVar3 = puVar3 + -1;
          *puVar5 = *puVar7;
          uVar6 = puVar5[-1];
          puVar5 = puVar5 + -1;
        } while ((long)uVar6 < 0);
        uVar13 = (ulong)(uVar14 & 0xfffffffe);
      }
      uVar14 = (uint)uVar13;
      *puVar3 = ~uVar6;
      if (puVar5 <= buf) goto LAB_0010338b;
      puVar9 = puVar3 + -1;
      *puVar5 = puVar3[-1];
      uVar6 = *puVar4;
      if ((uVar13 & 2) != 0) {
        do {
          *puVar9 = uVar6;
          puVar3 = puVar9 + -1;
          puVar9 = puVar9 + -1;
          *puVar4 = *puVar3;
          uVar6 = puVar4[-1];
          puVar4 = puVar4 + -1;
        } while ((long)uVar6 < 0);
        uVar14 = 0;
      }
      puVar5 = puVar5 + -1;
      *puVar9 = uVar6;
      puVar3 = puVar9 + -1;
      *puVar4 = puVar9[-1];
      puVar4 = puVar4 + -1;
      if (puVar4 < first) break;
      uVar6 = *puVar5;
      uVar14 = uVar14 | (uint)(uVar6 >> 0x3f);
      uVar13 = (ulong)uVar14;
      local_8a0 = PA + ((long)uVar6 >> 0x3f ^ uVar6);
      uVar6 = *puVar4;
      if ((long)uVar6 < 0) {
        p2 = PA + ~uVar6;
        uVar13 = (ulong)(uVar14 | 2);
      }
      else {
        p2 = PA + uVar6;
      }
    }
    for (; buf < puVar5; puVar5 = puVar5 + -1) {
      *puVar3 = *puVar5;
      puVar4 = puVar3 + -1;
      puVar3 = puVar3 + -1;
      *puVar5 = *puVar4;
    }
    goto LAB_0010337f;
  }
  goto LAB_0010339a;
LAB_001032c5:
  for (; buf < puVar5; puVar5 = puVar5 + -1) {
    *puVar3 = *puVar5;
    puVar4 = puVar3 + -1;
    puVar3 = puVar3 + -1;
    *puVar5 = *puVar4;
  }
LAB_0010337f:
  *puVar3 = *puVar5;
  puVar9 = puVar5;
LAB_0010338b:
  *puVar9 = uVar15;
LAB_0010339a:
  if ((uVar11 & 1) == 0) goto joined_r0x001033a8;
  uVar15 = *first;
  goto LAB_001033f0;
LAB_001032f0:
  for (; puVar5 < puVar9; puVar5 = puVar5 + 1) {
    *puVar3 = *puVar5;
    puVar4 = puVar3 + 1;
    puVar3 = puVar3 + 1;
    *puVar5 = *puVar4;
  }
  goto LAB_00103141;
LAB_00103131:
  for (; puVar5 < puVar9; puVar5 = puVar5 + 1) {
    *puVar3 = *puVar5;
    puVar4 = puVar3 + 1;
    puVar3 = puVar3 + 1;
    *puVar5 = *puVar4;
  }
LAB_00103141:
  puVar9 = puVar5;
  *puVar3 = *puVar9;
LAB_0010331e:
  *puVar9 = uVar15;
LAB_0010332a:
  if ((uVar11 & 1) == 0) {
joined_r0x001033a8:
    if ((uVar11 & 2) == 0) goto LAB_001033f6;
    uVar15 = *first;
    sVar2 = ss_compare(T,PA + ((long)((ulong *)first)[-1] >> 0x3f ^ ((ulong *)first)[-1]),
                       PA + uVar15,depth);
    if (sVar2 != 0) goto LAB_001033f6;
  }
  else {
    uVar15 = *first;
  }
LAB_001033f0:
  *first = ~uVar15;
LAB_001033f6:
  if ((uVar11 & 4) != 0) {
    uVar15 = *last;
    sVar2 = ss_compare(T,PA + ((long)((ulong *)last)[-1] >> 0x3f ^ ((ulong *)last)[-1]),PA + uVar15,
                       depth);
    if (sVar2 == 0) {
      *last = ~uVar15;
    }
  }
  if ((int)local_858 == 0) {
    return;
  }
  local_858 = (ulong)((int)local_858 - 1);
  first = (saidx64_t *)(&local_858)[lVar12 * 4];
  middle = local_850[lVar12 * 4];
  last = local_850[lVar12 * 4 + 1];
  uVar11 = stack[lVar12 + -1].d;
  goto LAB_00102aea;
code_r0x00102bc6:
  n = n + uVar15 + 1;
  uVar15 = uVar15 - (~(uint)uVar6 & 1);
  goto LAB_00102b53;
}

Assistant:

static
void
ss_swapmerge(const sauchar_t *T, const saidx_t *PA,
             saidx_t *first, saidx_t *middle, saidx_t *last,
             saidx_t *buf, saidx_t bufsize, saidx_t depth) {
#define STACK_SIZE SS_SMERGE_STACKSIZE
#define GETIDX(a) ((0 <= (a)) ? (a) : (~(a)))
#define MERGE_CHECK(a, b, c)\
  do {\
    if(((c) & 1) ||\
       (((c) & 2) && (ss_compare(T, PA + GETIDX(*((a) - 1)), PA + *(a), depth) == 0))) {\
      *(a) = ~*(a);\
    }\
    if(((c) & 4) && ((ss_compare(T, PA + GETIDX(*((b) - 1)), PA + *(b), depth) == 0))) {\
      *(b) = ~*(b);\
    }\
  } while(0)
  struct { saidx_t *a, *b, *c; saint_t d; } stack[STACK_SIZE];
  saidx_t *l, *r, *lm, *rm;
  saidx_t m, len, half;
  saint_t ssize;
  saint_t check, next;

  for(check = 0, ssize = 0;;) {
    if((last - middle) <= bufsize) {
      if((first < middle) && (middle < last)) {
        ss_mergebackward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    if((middle - first) <= bufsize) {
      if(first < middle) {
        ss_mergeforward(T, PA, first, middle, last, buf, depth);
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
      continue;
    }

    for(m = 0, len = MIN(middle - first, last - middle), half = len >> 1;
        0 < len;
        len = half, half >>= 1) {
      if(ss_compare(T, PA + GETIDX(*(middle + m + half)),
                       PA + GETIDX(*(middle - m - half - 1)), depth) < 0) {
        m += half + 1;
        half -= (len & 1) ^ 1;
      }
    }

    if(0 < m) {
      lm = middle - m, rm = middle + m;
      ss_blockswap(lm, middle, m);
      l = r = middle, next = 0;
      if(rm < last) {
        if(*rm < 0) {
          *rm = ~*rm;
          if(first < lm) { for(; *--l < 0;) { } next |= 4; }
          next |= 1;
        } else if(first < lm) {
          for(; *r < 0; ++r) { }
          next |= 2;
        }
      }

      if((l - first) <= (last - r)) {
        STACK_PUSH(r, rm, last, (next & 3) | (check & 4));
        middle = lm, last = l, check = (check & 3) | (next & 4);
      } else {
        if((next & 2) && (r == middle)) { next ^= 6; }
        STACK_PUSH(first, lm, l, (check & 3) | (next & 4));
        first = r, middle = rm, check = (next & 3) | (check & 4);
      }
    } else {
      if(ss_compare(T, PA + GETIDX(*(middle - 1)), PA + *middle, depth) == 0) {
        *middle = ~*middle;
      }
      MERGE_CHECK(first, last, check);
      STACK_POP(first, middle, last, check);
    }
  }
#undef STACK_SIZE
}